

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

void find_levels_r(opt_state_t *opt_state,icode *ic,block *b)

{
  int local_28;
  int local_24;
  int level;
  block *b_local;
  icode *ic_local;
  opt_state_t *opt_state_local;
  
  if (b->mark != ic->cur_mark) {
    b->mark = ic->cur_mark;
    b->link = (block *)0x0;
    if ((b->et).succ == (block *)0x0) {
      local_24 = 0;
    }
    else {
      find_levels_r(opt_state,ic,(b->et).succ);
      find_levels_r(opt_state,ic,(b->ef).succ);
      if (((b->ef).succ)->level < ((b->et).succ)->level) {
        local_28 = ((b->et).succ)->level;
      }
      else {
        local_28 = ((b->ef).succ)->level;
      }
      local_24 = local_28 + 1;
    }
    b->level = local_24;
    b->link = opt_state->levels[local_24];
    opt_state->levels[local_24] = b;
  }
  return;
}

Assistant:

static void
find_levels_r(opt_state_t *opt_state, struct icode *ic, struct block *b)
{
	int level;

	if (isMarked(ic, b))
		return;

	Mark(ic, b);
	b->link = 0;

	if (JT(b)) {
		find_levels_r(opt_state, ic, JT(b));
		find_levels_r(opt_state, ic, JF(b));
		level = MAX(JT(b)->level, JF(b)->level) + 1;
	} else
		level = 0;
	b->level = level;
	b->link = opt_state->levels[level];
	opt_state->levels[level] = b;
}